

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcan_attach.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__file;
  int iVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  char **in_RSI;
  int in_EDI;
  int s;
  int opt;
  char *name;
  char *tty;
  char buf [20];
  char *btr;
  char *speed;
  int send_read_status_flags;
  int send_close;
  int send_listen;
  int send_open;
  int waitkey;
  int detach;
  int ldisc;
  int fd;
  char *local_68;
  char local_58 [24];
  char *local_40;
  char *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined4 local_18;
  int local_14;
  char **local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_18 = 0x11;
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_30 = 0;
  local_38 = (char *)0x0;
  local_40 = (char *)0x0;
  local_68 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (iVar1 = getopt(local_8,local_10,"ldwocfs:b:n:?"), iVar1 != -1) {
    switch(iVar1) {
    case 0x3f:
    default:
      print_usage((char *)0x1015e4);
      break;
    case 0x62:
      local_40 = _optarg;
      sVar3 = strlen(_optarg);
      if (8 < sVar3) {
        print_usage((char *)0x10159f);
      }
      break;
    case 99:
      local_2c = 1;
      break;
    case 100:
      local_1c = 1;
      break;
    case 0x66:
      local_30 = 1;
      break;
    case 0x6c:
      local_28 = 1;
      break;
    case 0x6e:
      local_68 = _optarg;
      sVar3 = strlen(_optarg);
      if (0xf < sVar3) {
        print_usage((char *)0x1015d0);
      }
      break;
    case 0x6f:
      local_24 = 1;
      break;
    case 0x73:
      local_38 = _optarg;
      sVar3 = strlen(_optarg);
      if (1 < sVar3) {
        print_usage((char *)0x101568);
      }
      break;
    case 0x77:
      local_20 = 1;
    }
  }
  if (local_8 - _optind != 1) {
    print_usage((char *)0x10160e);
  }
  __file = local_10[_optind];
  local_14 = open(__file,0x101);
  if (-1 < local_14) {
    if ((local_20 != 0) || (local_1c == 0)) {
      if (local_38 != (char *)0x0) {
        sprintf(local_58,"C\rS%s\r",local_38);
        iVar1 = local_14;
        sVar3 = strlen(local_58);
        sVar4 = write(iVar1,local_58,sVar3);
        if (sVar4 < 1) {
          perror("write");
          exit(1);
        }
      }
      if (local_40 != (char *)0x0) {
        sprintf(local_58,"C\rs%s\r",local_40);
        iVar1 = local_14;
        sVar3 = strlen(local_58);
        sVar4 = write(iVar1,local_58,sVar3);
        if (sVar4 < 1) {
          perror("write");
          exit(1);
        }
      }
      if (local_30 != 0) {
        sprintf(local_58,"F\r");
        iVar1 = local_14;
        sVar3 = strlen(local_58);
        sVar4 = write(iVar1,local_58,sVar3);
        if (sVar4 < 1) {
          perror("write");
          exit(1);
        }
      }
      if (local_28 == 0) {
        if (local_24 != 0) {
          sprintf(local_58,"O\r");
          iVar1 = local_14;
          sVar3 = strlen(local_58);
          sVar4 = write(iVar1,local_58,sVar3);
          if (sVar4 < 1) {
            perror("write");
            exit(1);
          }
        }
      }
      else {
        sprintf(local_58,"L\r");
        iVar1 = local_14;
        sVar3 = strlen(local_58);
        sVar4 = write(iVar1,local_58,sVar3);
        if (sVar4 < 1) {
          perror("write");
          exit(1);
        }
      }
      iVar1 = ioctl(local_14,0x5423,&local_18);
      if (iVar1 < 0) {
        perror("ioctl TIOCSETD");
        exit(1);
      }
      iVar1 = ioctl(local_14,0x8910,&main::ifr);
      if (iVar1 < 0) {
        perror("ioctl SIOCGIFNAME");
        exit(1);
      }
      printf("attached tty %s to netdevice %s\n",__file,&main::ifr);
      if (local_68 != (char *)0x0) {
        iVar1 = socket(2,2,0);
        printf("rename netdevice %s to %s ... ",local_58,local_68);
        if (iVar1 < 0) {
          perror("socket for interface rename");
        }
        else {
          memset(&main::ifr.ifr_ifru,0,0x10);
          strncpy(main::ifr.ifr_ifru.ifru_slave,local_68,0xf);
          iVar2 = ioctl(iVar1,0x8923,&main::ifr);
          if (iVar2 < 0) {
            printf("failed!\n");
          }
          else {
            printf("ok.\n");
          }
          close(iVar1);
        }
      }
    }
    if (local_20 != 0) {
      printf("Press any key to detach %s ...\n",__file);
      getchar();
    }
    if ((local_20 != 0) || (local_1c != 0)) {
      local_18 = 0;
      iVar1 = ioctl(local_14,0x5423,&local_18);
      if (iVar1 < 0) {
        perror("ioctl");
        exit(1);
      }
      if (local_2c != 0) {
        sprintf(local_58,"C\r");
        iVar1 = local_14;
        sVar3 = strlen(local_58);
        sVar4 = write(iVar1,local_58,sVar3);
        if (sVar4 < 1) {
          perror("write");
          exit(1);
        }
      }
    }
    close(local_14);
    return 0;
  }
  perror(__file);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	int fd;
	int ldisc = N_SLCAN;
	int detach = 0;
	int waitkey = 0;
	int send_open = 0;
	int send_listen = 0;
	int send_close = 0;
	int send_read_status_flags = 0;
	char *speed = NULL;
	char *btr = NULL;
	char buf[20];
	static struct ifreq ifr;
	char *tty;
	char *name = NULL;
	int opt;

	while ((opt = getopt(argc, argv, "ldwocfs:b:n:?")) != -1) {
		switch (opt) {
		case 'd':
			detach = 1;
			break;

		case 'w':
			waitkey = 1;
			break;

		case 'o':
			send_open = 1;
			break;

		case 'l':
			send_listen = 1;
			break;

		case 'c':
			send_close = 1;
			break;

		case 'f':
			send_read_status_flags = 1;
			break;

		case 's':
			speed = optarg;
			if (strlen(speed) > 1)
				print_usage(argv[0]);
			break;

		case 'b':
			btr = optarg;
			if (strlen(btr) > 8)
				print_usage(argv[0]);
			break;

		case 'n':
			name = optarg;
			if (strlen(name) > sizeof(ifr.ifr_newname) - 1)
				print_usage(argv[0]);
			break;

		case '?':
		default:
			print_usage(argv[0]);
			break;
		}
	}

	if (argc - optind != 1)
		print_usage(argv[0]);

	tty = argv[optind];

	if ((fd = open (tty, O_WRONLY | O_NOCTTY)) < 0) {
		perror(tty);
		exit(1);
	}

	if (waitkey || !detach) {

		if (speed) {
			sprintf(buf, "C\rS%s\r", speed);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (btr) {
			sprintf(buf, "C\rs%s\r", btr);
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_read_status_flags) {
			sprintf(buf, "F\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		if (send_listen) {
			sprintf(buf, "L\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		} else if (send_open) {
			sprintf(buf, "O\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}

		/* set slcan line discipline on given tty */
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl TIOCSETD");
			exit(1);
		}

		/* retrieve the name of the created CAN netdevice */
		if (ioctl (fd, SIOCGIFNAME, ifr.ifr_name) < 0) {
			perror("ioctl SIOCGIFNAME");
			exit(1);
		}

		printf("attached tty %s to netdevice %s\n", tty, ifr.ifr_name);

		/* try to rename the created device if requested */
		if (name) {
			int s = socket(PF_INET, SOCK_DGRAM, 0);

			printf("rename netdevice %s to %s ... ", buf, name);

			if (s < 0)
				perror("socket for interface rename");
			else {
				/* current slcan%d name is still in ifr.ifr_name */
				memset (ifr.ifr_newname, 0, sizeof(ifr.ifr_newname));
				strncpy (ifr.ifr_newname, name, sizeof(ifr.ifr_newname) - 1);

				if (ioctl(s, SIOCSIFNAME, &ifr) < 0)
					printf("failed!\n");
				else
					printf("ok.\n");

				close(s);
			}
		}
	}

	if (waitkey) {
		printf("Press any key to detach %s ...\n", tty);
		getchar();
	}

	if (waitkey || detach) {
		ldisc = N_TTY;
		if (ioctl (fd, TIOCSETD, &ldisc) < 0) {
			perror("ioctl");
			exit(1);
		}

		if (send_close) {
			sprintf(buf, "C\r");
			if (write(fd, buf, strlen(buf)) <= 0) {
				perror("write");
				exit(EXIT_FAILURE);
			}
		}
	}

	close(fd);

	return 0;
}